

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *__n;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RCX;
  long in_RDX;
  void *in_RSI;
  long *in_RDI;
  void *newBuffer;
  size_t increment;
  size_t in_stack_ffffffffffffffd0;
  void *local_8;
  
  if (in_RSI == (void *)0x0) {
    local_8 = Malloc(in_RCX,in_stack_ffffffffffffffd0);
  }
  else if (in_RCX == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    __n = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)(in_RDX + 7U & 0xfffffffffffffff8);
    this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
              ((ulong)((long)&in_RCX->chunkHead_ + 7U) & 0xfffffffffffffff8);
    local_8 = in_RSI;
    if (__n < this_00) {
      if ((in_RSI == (void *)((*in_RDI + 0x18 + *(long *)(*in_RDI + 8)) - (long)__n)) &&
         (in_stack_ffffffffffffffd0 = (long)this_00 - (long)__n,
         *(long *)(*in_RDI + 8) + in_stack_ffffffffffffffd0 <= *(ulong *)*in_RDI)) {
        *(size_t *)(*in_RDI + 8) = in_stack_ffffffffffffffd0 + *(long *)(*in_RDI + 8);
      }
      else {
        local_8 = Malloc(this_00,in_stack_ffffffffffffffd0);
        if (local_8 == (void *)0x0) {
          local_8 = (void *)0x0;
        }
        else if (__n != (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
          memcpy(local_8,in_RSI,(size_t)__n);
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        if (newSize == 0)
            return NULL;

        originalSize = RAPIDJSON_ALIGN(originalSize);
        newSize = RAPIDJSON_ALIGN(newSize);

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == reinterpret_cast<char *>(chunkHead_) + RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + chunkHead_->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            if (chunkHead_->size + increment <= chunkHead_->capacity) {
                chunkHead_->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        if (void* newBuffer = Malloc(newSize)) {
            if (originalSize)
                std::memcpy(newBuffer, originalPtr, originalSize);
            return newBuffer;
        }
        else
            return NULL;
    }